

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O2

void avlUpdateNode(NodeAVL **tree,NodeAVL *nd,double key)

{
  NodeAVL *pNVar1;
  
  pNVar1 = avlGoUp(nd);
  pNVar1 = avlRemove0(pNVar1,0);
  *tree = pNVar1;
  nd->key = key;
  nd->parent = (NodeAVL *)0x0;
  nd->tmp = (NodeAVL *)0x0;
  nd->left = (NodeAVL *)0x0;
  nd->right = (NodeAVL *)0x0;
  nd->height = 1;
  pNVar1 = avlInsert0(*tree,nd);
  *tree = pNVar1;
  return;
}

Assistant:

void avlUpdateNode( NodeAVL **tree, NodeAVL* nd, const double key ){
    #ifdef DEBUG_AVL
      printf( "avlUpdateNode id=%d\n", nd->id );
    #endif
    *tree = avlRemove0( avlGoUp( nd ), 0 );
    nd->key = key;
    clearTreeMatters( nd );
    *tree = avlInsert0( *tree, nd );
}